

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O1

int ParseEXRMultipartHeaderFromMemory
              (EXRHeader ***exr_headers,int *num_headers,EXRVersion *exr_version,uchar *memory,
              char **err)

{
  char **ppcVar1;
  EXRHeader ***pppEVar2;
  undefined4 in_EAX;
  int iVar3;
  int iVar4;
  char *pcVar5;
  EXRHeader **ppEVar6;
  EXRHeader *exr_header;
  ulong uVar7;
  pointer paVar8;
  long lVar9;
  uchar *buf;
  ulong uVar10;
  undefined1 auVar11 [16];
  bool empty_header;
  vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> infos;
  string err_str;
  HeaderInfo info;
  bool local_10d;
  int local_10c;
  undefined1 local_108 [16];
  pointer local_f8;
  char **local_f0;
  string local_e8;
  EXRHeader ***local_c8;
  int *local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  int local_88 [4];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  auVar11._0_4_ = -(uint)(exr_headers == (EXRHeader ***)0x0);
  auVar11._4_4_ = -(uint)(memory == (uchar *)0x0);
  auVar11._8_4_ = -(uint)(num_headers == (int *)0x0);
  auVar11._12_4_ = -(uint)(exr_version == (EXRVersion *)0x0);
  iVar3 = movmskps(in_EAX,auVar11);
  iVar4 = -3;
  if (iVar3 == 0) {
    buf = memory + 8;
    local_108 = (undefined1  [16])0x0;
    local_f8 = (pointer)0x0;
    local_f0 = err;
    local_c8 = exr_headers;
    local_c0 = num_headers;
    do {
      local_a8 = (undefined1  [16])0x0;
      local_b8 = (undefined1  [16])0x0;
      local_98 = (undefined1  [16])0x0;
      local_48 = (undefined1  [16])0x0;
      local_58 = (undefined1  [16])0x0;
      local_68 = (undefined1  [16])0x0;
      local_78 = (undefined1  [16])0x0;
      local_88[0] = 0;
      local_88[1] = 0;
      local_88[2] = 0;
      local_88[3] = 0;
      local_e8._M_string_length = 0;
      local_e8.field_2._M_local_buf[0] = '\0';
      local_10d = false;
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      iVar4 = tinyexr::ParseEXRHeader((HeaderInfo *)local_b8,&local_10d,exr_version,&local_e8,buf);
      ppcVar1 = local_f0;
      if (iVar4 == 0) {
        if (local_10d == true) {
          buf = buf + 1;
          iVar3 = 2;
        }
        else if (local_58._4_4_ == 0) {
          local_10c = -4;
          iVar3 = 1;
          if (local_f0 != (char **)0x0) {
            *local_f0 = "`chunkCount\' attribute is not found in the header.";
          }
        }
        else {
          std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::push_back
                    ((vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> *)local_108,
                     (HeaderInfo *)local_b8);
          buf = buf + (uint)local_48._8_4_;
          iVar3 = 0;
        }
      }
      else {
        if (local_f0 != (char **)0x0) {
          pcVar5 = strdup(local_e8._M_dataplus._M_p);
          *ppcVar1 = pcVar5;
        }
        iVar3 = 1;
        local_10c = iVar4;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,
                        CONCAT71(local_e8.field_2._M_allocated_capacity._1_7_,
                                 local_e8.field_2._M_local_buf[0]) + 1);
      }
      if ((pointer)local_a8._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
      }
      std::vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_>::~vector
                ((vector<tinyexr::ChannelInfo,_std::allocator<tinyexr::ChannelInfo>_> *)local_b8);
    } while (iVar3 == 0);
    iVar4 = local_10c;
    if (iVar3 == 2) {
      ppEVar6 = (EXRHeader **)malloc((long)(local_108._8_8_ - local_108._0_8_) >> 4);
      pppEVar2 = local_c8;
      *local_c8 = ppEVar6;
      if (local_108._8_8_ == local_108._0_8_) {
        uVar7 = 0;
      }
      else {
        lVar9 = 0;
        uVar10 = 0;
        paVar8 = (pointer)local_108._0_8_;
        do {
          exr_header = (EXRHeader *)malloc(0x10890);
          tinyexr::ConvertHeader
                    (exr_header,(HeaderInfo *)((long)paVar8->data_window + lVar9 + -0x30));
          exr_header->tiled = exr_version->tiled;
          (*pppEVar2)[uVar10] = exr_header;
          uVar10 = uVar10 + 1;
          uVar7 = (long)(local_108._8_8_ - local_108._0_8_) >> 7;
          lVar9 = lVar9 + 0x80;
          paVar8 = (pointer)local_108._0_8_;
        } while (uVar10 < uVar7);
      }
      *local_c0 = (int)uVar7;
      iVar4 = 0;
    }
    std::vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_>::~vector
              ((vector<tinyexr::HeaderInfo,_std::allocator<tinyexr::HeaderInfo>_> *)local_108);
  }
  return iVar4;
}

Assistant:

int ParseEXRMultipartHeaderFromMemory(EXRHeader ***exr_headers,
                                      int *num_headers,
                                      const EXRVersion *exr_version,
                                      const unsigned char *memory,
                                      const char **err) {
  if (memory == NULL || exr_headers == NULL || num_headers == NULL ||
      exr_version == NULL) {
    // Invalid argument
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  const char *buf = reinterpret_cast<const char *>(memory);

  const char *marker = &buf[4 + 4];  // skip magic number + version header

  std::vector<tinyexr::HeaderInfo> infos;

  for (;;) {
    tinyexr::HeaderInfo info;
    info.clear();

    std::string err_str;
    bool empty_header = false;
    int ret = ParseEXRHeader(&info, &empty_header, exr_version, &err_str,
                             reinterpret_cast<const unsigned char *>(marker));

    if (ret != TINYEXR_SUCCESS) {
      if (err) {
        (*err) = strdup(err_str.c_str());  // may leak
      }
      return ret;
    }

    if (empty_header) {
      marker += 1;  // skip '\0'
      break;
    }

    // `chunkCount` must exist in the header.
    if (info.chunk_count == 0) {
      if (err) {
        (*err) = "`chunkCount' attribute is not found in the header.";
      }
      return TINYEXR_ERROR_INVALID_DATA;
    }

    infos.push_back(info);

    // move to next header.
    marker += info.header_len;
  }

  // allocate memory for EXRHeader and create array of EXRHeader pointers.
  (*exr_headers) =
      static_cast<EXRHeader **>(malloc(sizeof(EXRHeader *) * infos.size()));
  for (size_t i = 0; i < infos.size(); i++) {
    EXRHeader *exr_header = static_cast<EXRHeader *>(malloc(sizeof(EXRHeader)));

    ConvertHeader(exr_header, infos[i]);

    // transfoer `tiled` from version.
    exr_header->tiled = exr_version->tiled;

    (*exr_headers)[i] = exr_header;
  }

  (*num_headers) = static_cast<int>(infos.size());

  return TINYEXR_SUCCESS;
}